

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void google::protobuf::internal::ExtensionSet::RegisterEnumExtension
               (MessageLite *extendee,int number,FieldType type,bool is_repeated,bool is_packed,
               uint32_t *validation_data)

{
  FieldType *v2;
  char *failure_msg;
  LogMessage *pLVar1;
  undefined1 local_88 [8];
  ExtensionInfo info;
  LogMessage local_48;
  Voidify local_31;
  FieldType local_30;
  uchar local_29;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  uint32_t *validation_data_local;
  bool is_packed_local;
  bool is_repeated_local;
  FieldType type_local;
  MessageLite *pMStack_10;
  int number_local;
  MessageLite *extendee_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)validation_data;
  validation_data_local._1_1_ = is_packed;
  validation_data_local._2_1_ = is_repeated;
  validation_data_local._3_1_ = type;
  validation_data_local._4_4_ = number;
  pMStack_10 = extendee;
  local_29 = absl::lts_20250127::log_internal::GetReferenceableValue(type);
  local_30 = TYPE_ENUM;
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::WireFormatLite::FieldType>(&local_30);
  local_28 = absl::lts_20250127::log_internal::
             Check_EQImpl<unsigned_char,google::protobuf::internal::WireFormatLite::FieldType>
                       (&local_29,v2,"type == WireFormatLite::TYPE_ENUM");
  if (local_28 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_28);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x95,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_48);
  }
  ExtensionInfo::ExtensionInfo
            ((ExtensionInfo *)local_88,pMStack_10,validation_data_local._4_4_,
             validation_data_local._3_1_,(bool)(validation_data_local._2_1_ & 1),
             (bool)(validation_data_local._1_1_ & 1));
  info.number = 0;
  info.type = '\0';
  info.is_repeated = false;
  info.is_packed = false;
  info.is_lazy = kUndefined;
  info.field_6.enum_validity_check.func =
       (EnumValidityFuncWithArg *)absl_log_internal_check_op_result;
  anon_unknown_59::Register((ExtensionInfo *)local_88);
  return;
}

Assistant:

void ExtensionSet::RegisterEnumExtension(const MessageLite* extendee,
                                         int number, FieldType type,
                                         bool is_repeated, bool is_packed,
                                         const uint32_t* validation_data) {
  ABSL_CHECK_EQ(type, WireFormatLite::TYPE_ENUM);
  ExtensionInfo info(extendee, number, type, is_repeated, is_packed);
  info.enum_validity_check.func = nullptr;
  info.enum_validity_check.arg = validation_data;
  Register(info);
}